

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

_Bool sysbvm_scanner_advanceKeyword(sysbvm_scannerState_t *state)

{
  _Bool _Var1;
  int iVar2;
  undefined1 local_38 [8];
  sysbvm_scannerState_t endState;
  sysbvm_scannerState_t *state_local;
  
  endState.position = (size_t)state;
  iVar2 = sysbvm_scanner_lookAt(state,0);
  _Var1 = sysbvm_scanner_isIdentifierStart(iVar2);
  if (_Var1) {
    local_38 = *(undefined1 (*) [8])endState.position;
    endState.sourceCode = *(sysbvm_tuple_t *)(endState.position + 8);
    endState.text = *(uint8_t **)(endState.position + 0x10);
    endState.size = *(size_t *)(endState.position + 0x18);
    while( true ) {
      iVar2 = sysbvm_scanner_lookAt((sysbvm_scannerState_t *)local_38,0);
      _Var1 = sysbvm_scanner_isIdentifierMiddle(iVar2);
      if (!_Var1) break;
      endState.size = endState.size + 1;
    }
    iVar2 = sysbvm_scanner_lookAt((sysbvm_scannerState_t *)local_38,0);
    if (iVar2 == 0x3a) {
      *(undefined1 (*) [8])endState.position = local_38;
      *(sysbvm_tuple_t *)(endState.position + 8) = endState.sourceCode;
      *(uint8_t **)(endState.position + 0x10) = endState.text;
      *(size_t *)(endState.position + 0x18) = endState.size + 1;
      state_local._7_1_ = true;
    }
    else {
      state_local._7_1_ = false;
    }
  }
  else {
    state_local._7_1_ = false;
  }
  return state_local._7_1_;
}

Assistant:

static bool sysbvm_scanner_advanceKeyword(sysbvm_scannerState_t *state)
{
    if(!sysbvm_scanner_isIdentifierStart(sysbvm_scanner_lookAt(state, 0)))
        return false;

    sysbvm_scannerState_t endState = *state;
    while(sysbvm_scanner_isIdentifierMiddle(sysbvm_scanner_lookAt(&endState, 0)))
        ++endState.position;

    if(sysbvm_scanner_lookAt(&endState, 0) == ':')
    {
        ++endState.position;
        *state = endState;
        return true;
    }

    return false;
}